

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

void __thiscall
trompeloeil::list_elem<trompeloeil::call_matcher_base<void_()>_>::invariant_check
          (list_elem<trompeloeil::call_matcher_base<void_()>_> *this)

{
  list_elem<trompeloeil::call_matcher_base<void_()>_> *plVar1;
  list_elem<trompeloeil::call_matcher_base<void_()>_> *plVar2;
  list_elem<trompeloeil::call_matcher_base<void_()>_> *plVar3;
  list_elem<trompeloeil::call_matcher_base<void_()>_> *plVar4;
  
  plVar4 = this->next;
  if (plVar4->prev != this) {
    __assert_fail("next->prev == this",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                  ,0x60d,
                  "void trompeloeil::list_elem<trompeloeil::call_matcher_base<void ()>>::invariant_check() const [T = trompeloeil::call_matcher_base<void ()>]"
                 );
  }
  plVar3 = this->prev;
  if (plVar3->next != this) {
    __assert_fail("prev->next == this",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                  ,0x60e,
                  "void trompeloeil::list_elem<trompeloeil::call_matcher_base<void ()>>::invariant_check() const [T = trompeloeil::call_matcher_base<void ()>]"
                 );
  }
  if ((plVar4 == this) != (plVar3 == this)) {
    __assert_fail("(next == this) == (prev == this)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                  ,0x60f,
                  "void trompeloeil::list_elem<trompeloeil::call_matcher_base<void ()>>::invariant_check() const [T = trompeloeil::call_matcher_base<void ()>]"
                 );
  }
  if (plVar3->next != plVar4 && plVar4 == this) {
    __assert_fail("(prev->next == next) == (next == this)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                  ,0x610,
                  "void trompeloeil::list_elem<trompeloeil::call_matcher_base<void ()>>::invariant_check() const [T = trompeloeil::call_matcher_base<void ()>]"
                 );
  }
  if ((plVar4->prev != plVar3) == (plVar3 == this)) {
    __assert_fail("(next->prev == prev) == (prev == this)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                  ,0x611,
                  "void trompeloeil::list_elem<trompeloeil::call_matcher_base<void ()>>::invariant_check() const [T = trompeloeil::call_matcher_base<void ()>]"
                 );
  }
  do {
    if ((plVar3 == this) != (plVar4 == this)) {
      __assert_fail("(nn == this) == (pp == this)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x615,
                    "void trompeloeil::list_elem<trompeloeil::call_matcher_base<void ()>>::invariant_check() const [T = trompeloeil::call_matcher_base<void ()>]"
                   );
    }
    plVar1 = plVar4->next;
    if (plVar1->prev != plVar4) {
      __assert_fail("nn->next->prev == nn",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x616,
                    "void trompeloeil::list_elem<trompeloeil::call_matcher_base<void ()>>::invariant_check() const [T = trompeloeil::call_matcher_base<void ()>]"
                   );
    }
    if (plVar4->prev->next != plVar4) {
      __assert_fail("nn->prev->next == nn",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x617,
                    "void trompeloeil::list_elem<trompeloeil::call_matcher_base<void ()>>::invariant_check() const [T = trompeloeil::call_matcher_base<void ()>]"
                   );
    }
    if (plVar3->next->prev != plVar3) {
      __assert_fail("pp->next->prev == pp",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x618,
                    "void trompeloeil::list_elem<trompeloeil::call_matcher_base<void ()>>::invariant_check() const [T = trompeloeil::call_matcher_base<void ()>]"
                   );
    }
    plVar2 = plVar3->prev;
    if (plVar2->next != plVar3) {
      __assert_fail("pp->prev->next == pp",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x619,
                    "void trompeloeil::list_elem<trompeloeil::call_matcher_base<void ()>>::invariant_check() const [T = trompeloeil::call_matcher_base<void ()>]"
                   );
    }
    if ((plVar1 != plVar4) == (plVar4 == this)) {
      __assert_fail("(nn->next == nn) == (nn == this)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x61a,
                    "void trompeloeil::list_elem<trompeloeil::call_matcher_base<void ()>>::invariant_check() const [T = trompeloeil::call_matcher_base<void ()>]"
                   );
    }
    if ((plVar2 != plVar3) == (plVar3 == this)) {
      __assert_fail("(pp->prev == pp) == (pp == this)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x61b,
                    "void trompeloeil::list_elem<trompeloeil::call_matcher_base<void ()>>::invariant_check() const [T = trompeloeil::call_matcher_base<void ()>]"
                   );
    }
    plVar3 = plVar2;
    plVar4 = plVar1;
  } while (plVar1 != this);
  return;
}

Assistant:

void
    invariant_check()
    const
    noexcept
    {
#ifdef TROMPELOEIL_SANITY_CHECKS
      TROMPELOEIL_ASSERT(next->prev == this);
      TROMPELOEIL_ASSERT(prev->next == this);
      TROMPELOEIL_ASSERT((next == this) == (prev == this));
      TROMPELOEIL_ASSERT((prev->next == next) == (next == this));
      TROMPELOEIL_ASSERT((next->prev == prev) == (prev == this));
      auto pp = prev;
      auto nn = next;
      do {
        TROMPELOEIL_ASSERT((nn == this) == (pp == this));
        TROMPELOEIL_ASSERT(nn->next->prev == nn);
        TROMPELOEIL_ASSERT(nn->prev->next == nn);
        TROMPELOEIL_ASSERT(pp->next->prev == pp);
        TROMPELOEIL_ASSERT(pp->prev->next == pp);
        TROMPELOEIL_ASSERT((nn->next == nn) == (nn == this));
        TROMPELOEIL_ASSERT((pp->prev == pp) == (pp == this));
        nn = nn->next;
        pp = pp->prev;
      } while (nn != this);
#endif
    }